

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_hmac.c
# Opt level: O0

int csp_hmac_append(csp_packet_t *packet,_Bool include_header)

{
  byte in_SIL;
  long in_RDI;
  uint8_t hmac [20];
  uint8_t *in_stack_00000078;
  uint32_t in_stack_00000084;
  void *in_stack_00000088;
  uint32_t in_stack_00000094;
  void *in_stack_00000098;
  undefined4 local_28;
  undefined4 local_4;
  
  if (*(ushort *)(in_RDI + 0x2a) + 4 < 0x101) {
    if ((in_SIL & 1) == 0) {
      csp_hmac_memory(in_stack_00000098,in_stack_00000094,in_stack_00000088,in_stack_00000084,
                      in_stack_00000078);
      *(undefined4 *)(in_RDI + 0x48 + (ulong)*(ushort *)(in_RDI + 0x2a)) = local_28;
      *(short *)(in_RDI + 0x2a) = *(short *)(in_RDI + 0x2a) + 4;
    }
    else {
      csp_hmac_memory(in_stack_00000098,in_stack_00000094,in_stack_00000088,in_stack_00000084,
                      in_stack_00000078);
      *(undefined4 *)(*(long *)(in_RDI + 0x20) + (ulong)*(ushort *)(in_RDI + 0x28)) = local_28;
      *(short *)(in_RDI + 0x28) = *(short *)(in_RDI + 0x28) + 4;
      *(short *)(in_RDI + 0x2a) = *(short *)(in_RDI + 0x2a) + 4;
    }
    local_4 = 0;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int csp_hmac_append(csp_packet_t * packet, bool include_header) {

	if ((packet->length + (unsigned int)CSP_HMAC_LENGTH) > sizeof(packet->data)) {
		return CSP_ERR_NOMEM;
	}

	/* Calculate HMAC */
	uint8_t hmac[CSP_SHA1_DIGESTSIZE];

	if (include_header) {

		/* If header is included, csp_id_prepend() must be called beforehand */
		csp_hmac_memory(csp_hmac_key, sizeof(csp_hmac_key), packet->frame_begin, packet->frame_length, hmac);
		memcpy(&packet->frame_begin[packet->frame_length], hmac, CSP_HMAC_LENGTH);
		packet->frame_length += CSP_HMAC_LENGTH;
		packet->length += CSP_HMAC_LENGTH;

	} else {

		csp_hmac_memory(csp_hmac_key, sizeof(csp_hmac_key), packet->data, packet->length, hmac);
		memcpy(&packet->data[packet->length], hmac, CSP_HMAC_LENGTH);
		packet->length += CSP_HMAC_LENGTH;
	}

	return CSP_ERR_NONE;
}